

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scantag.cpp
# Opt level: O0

string * YAML::ScanTagHandle_abi_cxx11_(Stream *INPUT,bool *canBeHandle)

{
  bool bVar1;
  char cVar2;
  undefined8 uVar3;
  byte *in_RDX;
  Stream *in_RSI;
  string *in_RDI;
  Mark MVar4;
  int n;
  Mark firstNonWordChar;
  string *tag;
  undefined4 in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  RegEx *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  undefined8 in_stack_ffffffffffffff20;
  RegEx *in_stack_ffffffffffffff30;
  Stream *in_stack_ffffffffffffff38;
  string local_a0 [32];
  Mark local_80;
  Mark local_6c;
  int local_60;
  undefined1 local_5a;
  allocator local_59;
  string local_58 [48];
  Mark local_28;
  undefined1 local_19;
  byte *local_18;
  Stream *local_10;
  
  local_19 = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::__cxx11::string::string((string *)in_RDI);
  *local_18 = 1;
  Mark::Mark(&local_28);
  MVar4.column = in_stack_ffffffffffffff1c;
  MVar4.pos = (int)in_stack_ffffffffffffff20;
  MVar4.line = (int)((ulong)in_stack_ffffffffffffff20 >> 0x20);
  while( true ) {
    bVar1 = Stream::operator_cast_to_bool(MVar4._0_8_);
    if (!bVar1) {
      return in_RDI;
    }
    cVar2 = Stream::peek((Stream *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    if (cVar2 == '!') break;
    local_60 = 0;
    if ((*local_18 & 1) != 0) {
      in_stack_ffffffffffffff30 = Exp::Word();
      local_60 = RegEx::Match(MVar4._0_8_,(Stream *)CONCAT44(MVar4.column,in_stack_ffffffffffffff18)
                             );
      if (local_60 < 1) {
        *local_18 = 0;
        MVar4 = Stream::mark(local_10);
        local_80 = MVar4;
        local_6c = MVar4;
        local_28 = MVar4;
      }
    }
    if ((*local_18 & 1) == 0) {
      in_stack_ffffffffffffff10 = Exp::Tag();
      in_stack_ffffffffffffff0c =
           RegEx::Match(MVar4._0_8_,(Stream *)CONCAT44(MVar4.column,in_stack_ffffffffffffff18));
      local_60 = in_stack_ffffffffffffff0c;
    }
    if (local_60 < 1) {
      return in_RDI;
    }
    Stream::get_abi_cxx11_
              (in_stack_ffffffffffffff38,(int)((ulong)in_stack_ffffffffffffff30 >> 0x20));
    std::__cxx11::string::operator+=((string *)in_RDI,local_a0);
    std::__cxx11::string::~string(local_a0);
  }
  if ((*local_18 & 1) != 0) {
    return in_RDI;
  }
  local_5a = 1;
  uVar3 = __cxa_allocate_exception(0x40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_58,"illegal character found while scanning tag handle",&local_59);
  ParserException::ParserException
            (MVar4._0_8_,(Mark *)CONCAT44(MVar4.column,in_stack_ffffffffffffff18),
             (string *)in_stack_ffffffffffffff10);
  local_5a = 0;
  __cxa_throw(uVar3,&ParserException::typeinfo,ParserException::~ParserException);
}

Assistant:

const std::string ScanTagHandle(Stream& INPUT, bool& canBeHandle) {
  std::string tag;
  canBeHandle = true;
  Mark firstNonWordChar;

  while (INPUT) {
    if (INPUT.peek() == Keys::Tag) {
      if (!canBeHandle)
        throw ParserException(firstNonWordChar, ErrorMsg::CHAR_IN_TAG_HANDLE);
      break;
    }

    int n = 0;
    if (canBeHandle) {
      n = Exp::Word().Match(INPUT);
      if (n <= 0) {
        canBeHandle = false;
        firstNonWordChar = INPUT.mark();
      }
    }

    if (!canBeHandle)
      n = Exp::Tag().Match(INPUT);

    if (n <= 0)
      break;

    tag += INPUT.get(n);
  }

  return tag;
}